

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O1

pboolean p_ini_file_parameter_boolean(PIniFile *file,pchar *section,pchar *key,pboolean default_val)

{
  int iVar1;
  pchar *__s1;
  
  __s1 = pp_ini_file_find_parameter(file,section,key);
  if (__s1 != (pchar *)0x0) {
    iVar1 = strcmp(__s1,"true");
    default_val = 1;
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,"TRUE");
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1,"false");
        default_val = 0;
        if (iVar1 != 0) {
          iVar1 = strcmp(__s1,"FALSE");
          default_val = 0;
          if (iVar1 != 0) {
            iVar1 = atoi(__s1);
            default_val = (pboolean)(0 < iVar1);
          }
        }
      }
    }
    p_free(__s1);
  }
  return default_val;
}

Assistant:

P_LIB_API pboolean
p_ini_file_parameter_boolean (const PIniFile	*file,
			      const pchar	*section,
			      const pchar	*key,
			      pboolean		default_val)
{
	pchar		*val;
	pboolean	ret;

	if ((val = pp_ini_file_find_parameter (file, section, key)) == NULL)
		return default_val;

	if (strcmp (val, "true") == 0 || strcmp (val, "TRUE") == 0)
		ret = TRUE;
	else if (strcmp (val, "false") == 0 || strcmp (val, "FALSE") == 0)
		ret = FALSE;
	else if (atoi (val) > 0)
		ret = TRUE;
	else
		ret = FALSE;

	p_free (val);

	return ret;
}